

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O0

Aig_Man_t * Aig_ManRetimeFrontier(Aig_Man_t *p,int nStepsMax)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  void *pvVar9;
  Aig_Man_t *pAVar10;
  int fChange;
  int fCompl;
  int Counter;
  int i;
  Aig_Obj_t *pObjLi1;
  Aig_Obj_t *pObjLi0;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo1;
  Aig_Obj_t *pObjLo0;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  int nStepsMax_local;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                  ,0x81,"Aig_Man_t *Aig_ManRetimeFrontier(Aig_Man_t *, int)");
  }
  Aig_TableClear(p);
  Aig_ManRetimeMark(p);
  for (fCompl = 0; iVar2 = Aig_ManRegNum(p), fCompl < iVar2; fCompl = fCompl + 1) {
    pAVar5 = Aig_ManLi(p,fCompl);
    pAVar6 = Aig_ManLo(p,fCompl);
    *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
    (pAVar6->field_0).pNext = pAVar5;
    (pAVar5->field_0).pNext = pAVar6;
  }
  fChange = 0;
  bVar1 = true;
  do {
    if (!bVar1) {
      for (fCompl = 0; iVar2 = Aig_ManRegNum(p), fCompl < iVar2; fCompl = fCompl + 1) {
        pAVar5 = Aig_ManLi(p,fCompl);
        pAVar6 = Aig_ManLo(p,fCompl);
        *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef;
        (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
        (pAVar6->field_0).pNext = (Aig_Obj_t *)0x0;
      }
      for (fCompl = 0; iVar2 = Vec_PtrSize(p->vObjs), fCompl < iVar2; fCompl = fCompl + 1) {
        pvVar9 = Vec_PtrEntry(p->vObjs,fCompl);
        if (pvVar9 != (void *)0x0) {
          *(ulong *)((long)pvVar9 + 0x18) = *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf;
        }
      }
      Aig_ManSeqCleanup(p);
      pAVar10 = Aig_ManDupOrdered(p);
      return pAVar10;
    }
    bVar1 = false;
    for (fCompl = 0; iVar2 = Vec_PtrSize(p->vObjs), fCompl < iVar2; fCompl = fCompl + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,fCompl);
      if ((((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) &&
          ((*(ulong *)&pAVar5->field_0x18 >> 5 & 1) != 0)) &&
         (iVar2 = Aig_ObjIsBuf(pAVar5), iVar2 == 0)) {
        pAVar6 = Aig_ObjChild0(pAVar5);
        pAVar6 = Aig_ObjReal_rec(pAVar6);
        pAVar7 = Aig_ObjChild1(pAVar5);
        pAVar7 = Aig_ObjReal_rec(pAVar7);
        pAVar8 = Aig_Regular(pAVar6);
        if (((*(ulong *)&pAVar8->field_0x18 >> 4 & 1) != 0) &&
           (pAVar8 = Aig_Regular(pAVar7), (*(ulong *)&pAVar8->field_0x18 >> 4 & 1) != 0)) {
          uVar3 = Aig_IsComplement(pAVar6);
          uVar4 = Aig_IsComplement(pAVar7);
          pAVar8 = Aig_Regular(pAVar6);
          pAVar8 = Aig_ObjChild0((pAVar8->field_0).pNext);
          iVar2 = Aig_IsComplement(pAVar6);
          pAVar6 = Aig_NotCond(pAVar8,iVar2);
          pAVar8 = Aig_Regular(pAVar7);
          pAVar8 = Aig_ObjChild0((pAVar8->field_0).pNext);
          iVar2 = Aig_IsComplement(pAVar7);
          pAVar7 = Aig_NotCond(pAVar8,iVar2);
          pAVar6 = Aig_And(p,pAVar6,pAVar7);
          *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf | 0x20;
          pAVar7 = Aig_ObjCreateCi(p);
          *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffef | 0x10;
          pAVar6 = Aig_NotCond(pAVar6,uVar3 & uVar4);
          pAVar6 = Aig_ObjCreateCo(p,pAVar6);
          p->nRegs = p->nRegs + 1;
          (pAVar7->field_0).pNext = pAVar6;
          (pAVar6->field_0).pNext = pAVar7;
          Aig_ObjDisconnect(p,pAVar5);
          *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xfffffffffffffff8 | 4;
          p->nObjs[5] = p->nObjs[5] + -1;
          p->nObjs[4] = p->nObjs[4] + 1;
          pAVar6 = Aig_NotCond(pAVar7,uVar3 & uVar4);
          Aig_ObjConnect(p,pAVar5,pAVar6,(Aig_Obj_t *)0x0);
          bVar1 = true;
          fChange = fChange + 1;
          if (nStepsMax <= fChange) {
            bVar1 = false;
            break;
          }
        }
      }
    }
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManRetimeFrontier( Aig_Man_t * p, int nStepsMax )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLo, * pObjLo0, * pObjLo1, * pObjLi, * pObjLi0, * pObjLi1;//, * pObjLi0_, * pObjLi1_, * pObjLi0__, * pObjLi1__;
    int i, Counter, fCompl, fChange;
    assert( Aig_ManRegNum(p) > 0 );
    // remove structural hashing table
    Aig_TableClear( p );
    // mark the retimable nodes
    Aig_ManRetimeMark( p );
    // mark the register outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 1;
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // go through the nodes and find retimable ones
    Counter = 0;
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( !pObj->fMarkB )
                continue;
            if ( Aig_ObjIsBuf(pObj) )
                continue;
            // get the real inputs of the node (skipping the buffers)
            pObjLo0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
            pObjLo1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
            if ( !Aig_Regular(pObjLo0)->fMarkA || !Aig_Regular(pObjLo1)->fMarkA )
                continue;
            // remember complemented attribute
            fCompl = Aig_IsComplement(pObjLo0) & Aig_IsComplement(pObjLo1);
            // get the register inputs
//            pObjLi0_ = Aig_Regular(pObjLo0)->pNext;
//            pObjLi1_ = Aig_Regular(pObjLo1)->pNext;
//            pObjLi0__ = Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext);
//            pObjLi1__ = Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext);
            pObjLi0 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext), Aig_IsComplement(pObjLo0) );
            pObjLi1 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext), Aig_IsComplement(pObjLo1) );
            // create new node
            pObjNew = Aig_And( p, pObjLi0, pObjLi1 );
            pObjNew->fMarkB = 1;
            // create new register
            pObjLo = Aig_ObjCreateCi(p);
            pObjLo->fMarkA = 1;
            pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
            p->nRegs++;
            pObjLo->pNext = pObjLi;
            pObjLi->pNext = pObjLo;
            // add the buffer
            Aig_ObjDisconnect( p, pObj );
            pObj->Type = AIG_OBJ_BUF;
            p->nObjs[AIG_OBJ_AND]--;
            p->nObjs[AIG_OBJ_BUF]++;
            Aig_ObjConnect( p, pObj, Aig_NotCond(pObjLo, fCompl), NULL );
            // create HAIG if defined
            // mark the change
            fChange = 1;
            // check the limit
            if ( ++Counter >= nStepsMax )
            {
                fChange = 0;
                break;
            }
        }
    }
    // clean the markings
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 0;
        pObjLo->pNext = pObjLi->pNext = NULL;
    }
    Aig_ManForEachObj( p, pObj, i )
        pObj->fMarkB = 0;
    // remove useless registers
    Aig_ManSeqCleanup( p );
    // rehash the nodes
    return Aig_ManDupOrdered( p ); 
}